

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

void __thiscall
Lib::
BinaryHeap<Shell::BlockedClauseElimination::Candidate_*,_Shell::BlockedClauseElimination::CandidateComparator>
::expand(BinaryHeap<Shell::BlockedClauseElimination::Candidate_*,_Shell::BlockedClauseElimination::CandidateComparator>
         *this)

{
  Candidate **__ptr;
  Candidate **ppCVar1;
  long lVar2;
  ulong uVar3;
  
  __ptr = this->_data;
  uVar3 = 4;
  if (this->_capacity != 0) {
    uVar3 = (ulong)(this->_capacity * 2);
  }
  this->_capacity = (uint)uVar3;
  ppCVar1 = (Candidate **)Lib::alloc(uVar3 << 3);
  this->_data = ppCVar1;
  this->_data1 = ppCVar1 + -1;
  if ((ulong)this->_size != 0) {
    lVar2 = (ulong)this->_size << 3;
    do {
      *(undefined8 *)((long)ppCVar1 + lVar2 + -8) = *(undefined8 *)((long)__ptr + lVar2 + -8);
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0);
  }
  if (__ptr != (Candidate **)0x0) {
    Lib::free(__ptr);
    return;
  }
  return;
}

Assistant:

void expand()
  {
    ASS(_capacity==_size);

    unsigned oldCapacity=_capacity;
    T* oldData=_data;

    _capacity= _capacity ? _capacity*2 : 4;

    void* mem = ALLOC_KNOWN(_capacity*sizeof(T),"BinaryHeap::T");
    _data = static_cast<T*>(mem);
    _data1 = _data-1;

    if(_size) {
      T* otp = oldData+_size;
      T* ntp = _data+_size;
      do {
	::new (--ntp) T(*(--otp));
	//because oldCapacity==_size, we destroy all elements of oldData array here
	otp->~T();
      } while(ntp!=_data);
    }

    if(oldData) {
      DEALLOC_KNOWN(oldData,oldCapacity*sizeof(T),"BinaryHeap::T");
    }
  }